

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

Socket * __thiscall asl::Socket::operator>>(Socket *this,longlong *x)

{
  Endian EVar1;
  size_t in_RCX;
  longlong *x_local;
  Socket *this_local;
  
  read(this,(int)x,(void *)0x8,in_RCX);
  EVar1 = endian(this);
  if (EVar1 == ENDIAN_BIG) {
    swapBytes<long_long>(x);
  }
  return this;
}

Assistant:

Socket& operator>>(T& x)
	{
		read(&x, sizeof(x));
		if (endian() == ASL_OTHER_ENDIAN)
			swapBytes(x);
		return *this;
	}